

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void luaG_typeerror(lua_State *L,TValue *o,char *op)

{
  char *pcVar1;
  char *kind;
  char *t;
  char *name;
  char *op_local;
  TValue *o_local;
  lua_State *L_local;
  
  pcVar1 = luaT_typenames[o->tt];
  isinstack(L->ci,o);
  luaG_runerror(L,"attempt to %s a %s value",op,pcVar1);
  return;
}

Assistant:

static void luaG_typeerror(lua_State*L,const TValue*o,const char*op){
const char*name=NULL;
const char*t=luaT_typenames[ttype(o)];
const char*kind=(isinstack(L->ci,o))?
NULL:
NULL;
if(kind)
luaG_runerror(L,"attempt to %s %s "LUA_QL("%s")" (a %s value)",
op,kind,name,t);
else
luaG_runerror(L,"attempt to %s a %s value",op,t);
}